

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O1

int lj_cf_jit_util_tracesnap(lua_State *L)

{
  uint *puVar1;
  long lVar2;
  byte bVar3;
  uint64_t uVar4;
  uint uVar5;
  TValue *pTVar6;
  uint narray;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  GCtab *t;
  
  uVar5 = lj_lib_checkint(L,1);
  if ((uVar5 == 0) || (uVar4 = (L->glref).ptr64, *(uint *)(uVar4 + 0x46c) <= uVar5)) {
    lVar10 = 0;
  }
  else {
    lVar10 = *(long *)(*(long *)(uVar4 + 0x460) + (ulong)uVar5 * 8);
  }
  uVar5 = lj_lib_checkint(L,2);
  iVar8 = 0;
  if ((lVar10 != 0) && (iVar8 = 0, uVar5 < *(ushort *)(lVar10 + 10))) {
    puVar1 = (uint *)(*(long *)(lVar10 + 0x30) + (ulong)uVar5 * 0xc);
    uVar5 = *puVar1;
    lVar10 = *(long *)(lVar10 + 0x38);
    bVar3 = *(byte *)((long)puVar1 + 10);
    narray = bVar3 + 2;
    lua_createtable(L,narray,0);
    t = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
    if (t->asize == 0) {
      pTVar6 = lj_tab_setinth(L,t,0);
    }
    else {
      pTVar6 = (TValue *)(t->array).ptr64;
    }
    pTVar6->n = (double)(int)((ushort)puVar1[1] - 0x8000);
    if (t->asize < 2) {
      pTVar6 = lj_tab_setinth(L,t,1);
    }
    else {
      pTVar6 = (TValue *)((t->array).ptr64 + 8);
    }
    pTVar6->n = (double)(byte)puVar1[2];
    if ((ulong)bVar3 != 0) {
      uVar7 = 2;
      lVar9 = 0x10;
      do {
        if (uVar7 < t->asize) {
          pTVar6 = (TValue *)((t->array).ptr64 + lVar9);
        }
        else {
          pTVar6 = lj_tab_setinth(L,t,(int32_t)uVar7);
        }
        pTVar6->n = (double)*(int *)((ulong)uVar5 * 4 + lVar10 + -8 + uVar7 * 4);
        lVar9 = lVar9 + 8;
        lVar2 = uVar7 - bVar3;
        uVar7 = uVar7 + 1;
      } while (lVar2 != 1);
    }
    if (narray < t->asize) {
      pTVar6 = (TValue *)((ulong)(narray * 8) + (t->array).ptr64);
    }
    else {
      pTVar6 = lj_tab_setinth(L,t,narray);
    }
    pTVar6->u64 = 0xc170000000000000;
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

LJLIB_CF(jit_util_tracesnap)
{
  GCtrace *T = jit_checktrace(L);
  SnapNo sn = (SnapNo)lj_lib_checkint(L, 2);
  if (T && sn < T->nsnap) {
    SnapShot *snap = &T->snap[sn];
    SnapEntry *map = &T->snapmap[snap->mapofs];
    MSize n, nent = snap->nent;
    GCtab *t;
    lua_createtable(L, nent+2, 0);
    t = tabV(L->top-1);
    setintV(lj_tab_setint(L, t, 0), (int32_t)snap->ref - REF_BIAS);
    setintV(lj_tab_setint(L, t, 1), (int32_t)snap->nslots);
    for (n = 0; n < nent; n++)
      setintV(lj_tab_setint(L, t, (int32_t)(n+2)), (int32_t)map[n]);
    setintV(lj_tab_setint(L, t, (int32_t)(nent+2)), (int32_t)SNAP(255, 0, 0));
    return 1;
  }
  return 0;
}